

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
::operator==(DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
             *this,ConstIterator *RHS)

{
  bool bVar1;
  bool bVar2;
  void *pvVar3;
  void *pvVar4;
  ConstIterator *RHS_local;
  DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  *this_local;
  
  if (this->Ptr == (pointer)0x0) {
LAB_002b0e75:
    bVar1 = true;
  }
  else {
    bVar2 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)this);
    bVar1 = false;
    if (bVar2) goto LAB_002b0e75;
  }
  if (!bVar1) {
    __assert_fail("(!Ptr || isHandleInSync()) && \"handle not in sync!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x48d,
                  "bool llvm::DenseMapIterator<unsigned long, std::vector<unsigned char>>::operator==(const ConstIterator &) const [KeyT = unsigned long, ValueT = std::vector<unsigned char>, KeyInfoT = llvm::DenseMapInfo<unsigned long>, Bucket = llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>, IsConst = false]"
                 );
  }
  if (RHS->Ptr != (pointer)0x0) {
    bVar2 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)RHS);
    bVar1 = false;
    if (!bVar2) goto LAB_002b0ece;
  }
  bVar1 = true;
LAB_002b0ece:
  if (!bVar1) {
    __assert_fail("(!RHS.Ptr || RHS.isHandleInSync()) && \"handle not in sync!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x48e,
                  "bool llvm::DenseMapIterator<unsigned long, std::vector<unsigned char>>::operator==(const ConstIterator &) const [KeyT = unsigned long, ValueT = std::vector<unsigned char>, KeyInfoT = llvm::DenseMapInfo<unsigned long>, Bucket = llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>, IsConst = false]"
                 );
  }
  pvVar3 = DebugEpochBase::HandleBase::getEpochAddress((HandleBase *)this);
  pvVar4 = DebugEpochBase::HandleBase::getEpochAddress((HandleBase *)RHS);
  if (pvVar3 == pvVar4) {
    return this->Ptr == RHS->Ptr;
  }
  __assert_fail("getEpochAddress() == RHS.getEpochAddress() && \"comparing incomparable iterators!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x490,
                "bool llvm::DenseMapIterator<unsigned long, std::vector<unsigned char>>::operator==(const ConstIterator &) const [KeyT = unsigned long, ValueT = std::vector<unsigned char>, KeyInfoT = llvm::DenseMapInfo<unsigned long>, Bucket = llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>, IsConst = false]"
               );
}

Assistant:

bool operator==(const ConstIterator &RHS) const {
    assert((!Ptr || isHandleInSync()) && "handle not in sync!");
    assert((!RHS.Ptr || RHS.isHandleInSync()) && "handle not in sync!");
    assert(getEpochAddress() == RHS.getEpochAddress() &&
           "comparing incomparable iterators!");
    return Ptr == RHS.Ptr;
  }